

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Operation.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Operation::ArchiveIN(ChFunction_Operation *this,ChArchiveIn *marchive)

{
  eChOperation_mapper mmapper;
  eChOperation_mapper local_80;
  ChEnumMapper<chrono::ChFunction_Operation::eChOperation> local_60;
  char *local_40;
  ChEnumMapper<chrono::ChFunction_Operation::eChOperation> *local_38;
  undefined1 local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Operation>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.value_ptr =
       (eChOperation *)&this->fa;
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa0f9a3;
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.value_ptr =
       (eChOperation *)&this->fb;
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa126de;
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  eChOperation_mapper::eChOperation_mapper(&local_80);
  eChOperation_mapper::operator()(&local_60,&local_80,&this->op_type);
  local_40 = "operation_type";
  local_30 = 0;
  local_38 = &local_60;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6d158
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6d158;
  if (local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::ChFunction_Operation::eChOperation>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunction_Operation::eChOperation>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChFunction_Operation::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Operation>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(fa);
    marchive >> CHNVP(fb);
    eChOperation_mapper mmapper;
    marchive >> CHNVP(mmapper(op_type), "operation_type");
}